

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

Var Js::JavascriptString::CallRegExFunction<1>
              (RecyclableObject *fnObj,Var regExp,Arguments *args,ScriptContext *scriptContext)

{
  bool bVar1;
  ImplicitCallFlags IVar2;
  ThreadContext *this;
  bool bVar3;
  Attributes attributes;
  RecyclableObject *ptr;
  anon_class_40_4_a3bf5f9f local_50;
  
  this = scriptContext->threadContext;
  local_50.args.Info = args->Info;
  local_50.args.Values = args->Values;
  bVar1 = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  local_50.threadContext = this;
  local_50.fnObj = fnObj;
  local_50.regExp = regExp;
  attributes = FunctionInfo::GetAttributes(fnObj);
  bVar3 = ThreadContext::HasNoSideEffect(this,fnObj,attributes);
  if (bVar3) {
    ptr = (RecyclableObject *)CallRegExFunction<1>::anon_class_40_4_a3bf5f9f::operator()(&local_50);
    bVar3 = ThreadContext::IsOnStack(ptr);
  }
  else {
    if ((this->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
      ptr = (((((((((fnObj->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
            super_JavascriptLibraryBase).undefinedValue.ptr;
      goto LAB_00bbec6c;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar2 = this->implicitCallFlags;
      ptr = (RecyclableObject *)
            CallRegExFunction<1>::anon_class_40_4_a3bf5f9f::operator()(&local_50);
      this->implicitCallFlags = IVar2 | ImplicitCall_Accessor;
      goto LAB_00bbec6c;
    }
    ptr = (RecyclableObject *)CallRegExFunction<1>::anon_class_40_4_a3bf5f9f::operator()(&local_50);
    bVar3 = ThreadContext::IsOnStack(ptr);
  }
  if (bVar3 != false) {
    this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00bbec6c:
  this->reentrancySafeOrHandled = bVar1;
  return ptr;
}

Assistant:

Var JavascriptString::CallRegExFunction<1>(RecyclableObject* fnObj, Var regExp, Arguments& args, ScriptContext *scriptContext)
    {
        // args[0]: String
        ThreadContext * threadContext = scriptContext->GetThreadContext();
        return threadContext->ExecuteImplicitCall(fnObj, ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, fnObj, CallInfo(CallFlags_Value, 2), regExp, args[0]);
        });
    }